

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::PropertyInstance::ParseInstance
               (char **pCur,Property *prop,PropertyInstance *p_pcOut)

{
  EDataType eType;
  Property *pCur_00;
  bool bVar1;
  reference out;
  ValueUnion local_50;
  ValueUnion v_1;
  ValueUnion VStack_40;
  uint i;
  uint local_34;
  ValueUnion VStack_30;
  uint iNum;
  ValueUnion v;
  PropertyInstance *p_pcOut_local;
  Property *prop_local;
  char **pCur_local;
  
  v = (ValueUnion)p_pcOut;
  p_pcOut_local = (PropertyInstance *)prop;
  prop_local = (Property *)pCur;
  if (prop == (Property *)0x0) {
    __assert_fail("__null != prop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                  ,0x343,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstance(const char *&, const PLY::Property *, PLY::PropertyInstance *)"
                 );
  }
  if (p_pcOut != (PropertyInstance *)0x0) {
    bVar1 = SkipSpaces<char>(pCur);
    if (bVar1) {
      if (((ulong)p_pcOut_local[1].avList.
                  super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
        ParseValue((char **)prop_local,
                   *(EDataType *)
                    &(p_pcOut_local->avList).
                     super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start,&local_50);
        std::
        vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ::push_back((vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                     *)v,&local_50);
      }
      else {
        ParseValue((char **)prop_local,
                   *(EDataType *)
                    ((long)&p_pcOut_local[1].avList.
                            super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   &stack0xffffffffffffffd0);
        VStack_40 = VStack_30;
        local_34 = ConvertTo<unsigned_int>
                             (VStack_30,
                              *(EDataType *)
                               ((long)&p_pcOut_local[1].avList.
                                       super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        std::
        vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ::resize((vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  *)v,(ulong)local_34);
        for (v_1._4_4_ = 0; (uint)v_1._4_4_ < local_34; v_1._4_4_ = v_1._4_4_ + 1) {
          bVar1 = SkipSpaces<char>((char **)prop_local);
          pCur_00 = prop_local;
          if (!bVar1) {
            return false;
          }
          eType = *(EDataType *)
                   &(p_pcOut_local->avList).
                    super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          out = std::
                vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                ::operator[]((vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                              *)v,(ulong)(uint)v_1._4_4_);
          ParseValue((char **)pCur_00,eType,out);
        }
      }
      SkipSpacesAndLineEnd<char>((char **)prop_local);
      pCur_local._7_1_ = true;
    }
    else {
      pCur_local._7_1_ = false;
    }
    return pCur_local._7_1_;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyParser.cpp"
                ,0x344,
                "static bool Assimp::PLY::PropertyInstance::ParseInstance(const char *&, const PLY::Property *, PLY::PropertyInstance *)"
               );
}

Assistant:

bool PLY::PropertyInstance::ParseInstance(const char* &pCur,
  const PLY::Property* prop, PLY::PropertyInstance* p_pcOut)
{
  ai_assert(NULL != prop);
  ai_assert(NULL != p_pcOut);

  // skip spaces at the beginning
  if (!SkipSpaces(&pCur))
  {
    return false;
  }

  if (prop->bIsList)
  {
    // parse the number of elements in the list
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValue(pCur, prop->eFirstType, &v);

    // convert to unsigned int
    unsigned int iNum = PLY::PropertyInstance::ConvertTo<unsigned int>(v, prop->eFirstType);

    // parse all list elements
    p_pcOut->avList.resize(iNum);
    for (unsigned int i = 0; i < iNum; ++i)
    {
      if (!SkipSpaces(&pCur))
        return false;

      PLY::PropertyInstance::ParseValue(pCur, prop->eType, &p_pcOut->avList[i]);
    }
  }
  else
  {
    // parse the property
    PLY::PropertyInstance::ValueUnion v;

    PLY::PropertyInstance::ParseValue(pCur, prop->eType, &v);
    p_pcOut->avList.push_back(v);
  }
  SkipSpacesAndLineEnd(&pCur);
  return true;
}